

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialization.h
# Opt level: O2

void tsbp::Serializer::WriteToJson<tsbp::Packing2D>(Packing2D *classToSerialize,string *filePath)

{
  char cVar1;
  undefined8 *puVar2;
  json jsonFile;
  ofstream ofs;
  undefined8 auStack_200 [62];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&jsonFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filePath,
                 ".json");
  std::ofstream::ofstream(&ofs,(string *)&jsonFile,_S_out);
  std::__cxx11::string::~string((string *)&jsonFile);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json<tsbp::Packing2D_&,_tsbp::Packing2D,_0>(&jsonFile,classToSerialize);
    *(undefined8 *)((long)auStack_200 + *(long *)(_ofs + -0x18)) = 2;
    nlohmann::operator<<((ostream *)&ofs,&jsonFile);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&jsonFile);
    std::ofstream::close();
    std::ofstream::~ofstream(&ofs);
    return;
  }
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure
            ((char *)&jsonFile,(error_code *)"File stream not open.");
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &__cxxabiv1::__pointer_type_info::vtable;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void WriteToJson(T& classToSerialize, const std::string& filePath)
    {
        std::ofstream ofs(filePath + ".json");
        {
            if (!ofs.is_open())
            {
                auto ex = std::ios_base::failure("File stream not open.");
                throw std::exception(ex);
            }

            json jsonFile = classToSerialize;
            ofs << std::setw(2) << jsonFile;
        }

        ofs.close();
    }